

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mct.c
# Opt level: O2

void jpc_iict(jas_matrix_t *c0,jas_matrix_t *c1,jas_matrix_t *c2)

{
  ulong uVar1;
  jas_seqent_t *pjVar2;
  jas_seqent_t *pjVar3;
  jas_seqent_t *pjVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar8 = (int)c0->numrows_;
  if ((c1->numrows_ != (long)iVar8) || (c2->numrows_ != c1->numrows_)) {
    __assert_fail("jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                  ,0xe8,"void jpc_iict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
  }
  uVar1 = c0->numcols_;
  if ((c1->numcols_ == (long)(int)uVar1) && (c2->numcols_ == c1->numcols_)) {
    uVar12 = 0;
    uVar9 = c0->numrows_ & 0xffffffff;
    if (iVar8 < 1) {
      uVar9 = uVar12;
    }
    for (; uVar12 != uVar9; uVar12 = uVar12 + 1) {
      pjVar2 = c0->rows_[uVar12];
      pjVar3 = c1->rows_[uVar12];
      pjVar4 = c2->rows_[uVar12];
      lVar10 = 0;
      for (uVar11 = uVar1 & 0xffffffff; 0 < (int)uVar11; uVar11 = (ulong)((int)uVar11 - 1)) {
        lVar5 = *(long *)((long)pjVar2 + lVar10);
        lVar6 = *(long *)((long)pjVar3 + lVar10);
        lVar7 = *(long *)((long)pjVar4 + lVar10);
        *(long *)((long)pjVar2 + lVar10) = (lVar7 * 0x2cdd >> 0xd) + lVar5;
        *(long *)((long)pjVar3 + lVar10) =
             (lVar7 * -0x16da >> 0xd) + (lVar6 * -0xb03 >> 0xd) + lVar5;
        *(long *)((long)pjVar4 + lVar10) = (lVar6 * 0x38b4 >> 0xd) + lVar5;
        lVar10 = lVar10 + 8;
      }
    }
    return;
  }
  __assert_fail("jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_mct.c"
                ,0xea,"void jpc_iict(jas_matrix_t *, jas_matrix_t *, jas_matrix_t *)");
}

Assistant:

void jpc_iict(jas_matrix_t *c0, jas_matrix_t *c1, jas_matrix_t *c2)
{
	int numrows;
	int numcols;
	int i;
	int j;
	jpc_fix_t r;
	jpc_fix_t g;
	jpc_fix_t b;
	jpc_fix_t y;
	jpc_fix_t u;
	jpc_fix_t v;
	jpc_fix_t *c0p;
	jpc_fix_t *c1p;
	jpc_fix_t *c2p;

	numrows = jas_matrix_numrows(c0);
	assert(jas_matrix_numrows(c1) == numrows && jas_matrix_numrows(c2) == numrows);
	numcols = jas_matrix_numcols(c0);
	assert(jas_matrix_numcols(c1) == numcols && jas_matrix_numcols(c2) == numcols);
	for (i = 0; i < numrows; ++i) {
		c0p = jas_matrix_getref(c0, i, 0);
		c1p = jas_matrix_getref(c1, i, 0);
		c2p = jas_matrix_getref(c2, i, 0);
		for (j = numcols; j > 0; --j) {
			y = *c0p;
			u = *c1p;
			v = *c2p;
			r = jpc_fix_add(y, jpc_fix_mul(jpc_dbltofix(1.402), v));
			g = jpc_fix_add3(y, jpc_fix_mul(jpc_dbltofix(-0.34413), u),
			  jpc_fix_mul(jpc_dbltofix(-0.71414), v));
			b = jpc_fix_add(y, jpc_fix_mul(jpc_dbltofix(1.772), u));
			*c0p++ = r;
			*c1p++ = g;
			*c2p++ = b;
		}
	}
}